

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::hyperChooseColumn(HEkkPrimal *this)

{
  double dVar1;
  HEkk *pHVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *__format;
  HighsInt iEntry;
  long lVar7;
  double dVar8;
  double local_58;
  
  if ((this->use_hyper_chuzc != true) || (this->initialise_hyper_chuzc != false)) {
    return;
  }
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2d,0);
  pHVar2 = this->ekk_instance_;
  if (this->report_hyper_chuzc == true) {
    printf("H-S  CHUZC: Max changed measure is %9.4g for column %4d",this->max_changed_measure_value
           ,(ulong)(uint)this->max_changed_measure_column);
  }
  local_58 = this->max_changed_measure_value;
  this->variable_in = -1;
  iVar4 = this->max_changed_measure_column;
  iVar6 = -1;
  if ((-1 < (long)iVar4) &&
     ((dVar8 = (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start[iVar4], dVar8 != 0.0 || (NAN(dVar8))))) {
    this->variable_in = iVar4;
    iVar6 = iVar4;
  }
  iVar5 = this->num_hyper_chuzc_candidates;
  if (iVar5 != 0) {
    iVar4 = (this->nonbasic_free_col_set).count_;
    for (lVar7 = 1; lVar7 <= iVar5; lVar7 = lVar7 + 1) {
      iVar6 = (this->hyper_chuzc_candidate).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      if ((pHVar2->basis_).nonbasicFlag_.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[iVar6] != '\0') {
        dVar8 = (double)-(int)(pHVar2->basis_).nonbasicMove_.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar6] *
                (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar6];
        if (iVar4 != 0) {
          bVar3 = HSet::in(&this->nonbasic_free_col_set,iVar6);
          if (bVar3) {
            dVar8 = ABS((pHVar2->info_).workDual_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar6]);
          }
        }
        if (this->dual_feasibility_tolerance <= dVar8 && dVar8 != this->dual_feasibility_tolerance)
        {
          dVar1 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar6];
          if (local_58 * dVar1 < dVar8 * dVar8) {
            local_58 = (dVar8 * dVar8) / dVar1;
            this->variable_in = iVar6;
          }
        }
      }
      iVar5 = this->num_hyper_chuzc_candidates;
    }
    iVar6 = this->variable_in;
    iVar4 = this->max_changed_measure_column;
  }
  if (iVar6 == iVar4) {
    dVar8 = this->max_hyper_chuzc_non_candidate_measure;
  }
  else {
    if (this->report_hyper_chuzc == true) {
      printf(", and after HS CHUZC set it is now %9.4g for column %4d",local_58);
    }
    dVar8 = this->max_hyper_chuzc_non_candidate_measure;
    if (this->max_hyper_chuzc_non_candidate_measure <= this->max_changed_measure_value) {
      dVar8 = this->max_changed_measure_value;
    }
    this->max_hyper_chuzc_non_candidate_measure = dVar8;
  }
  if (dVar8 <= local_58) {
    this->done_next_chuzc = true;
    if (this->report_hyper_chuzc == false) goto LAB_00346bdf;
    __format = ", and no       has  measure >  %9.4g\n";
  }
  else {
    this->initialise_hyper_chuzc = true;
    this->done_next_chuzc = false;
    if (this->report_hyper_chuzc != true) goto LAB_00346bdf;
    __format = ", but some may have measure >= %9.4g\n";
  }
  printf(__format);
LAB_00346bdf:
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2d,0);
  return;
}

Assistant:

void HEkkPrimal::hyperChooseColumn() {
  if (!use_hyper_chuzc) return;
  if (initialise_hyper_chuzc) return;
  analysis->simplexTimerStart(ChuzcHyperClock);
  const vector<int8_t>& nonbasicMove = ekk_instance_.basis_.nonbasicMove_;
  const vector<int8_t>& nonbasicFlag = ekk_instance_.basis_.nonbasicFlag_;
  const vector<double>& workDual = ekk_instance_.info_.workDual_;
  if (report_hyper_chuzc)
    printf(
        "H-S  CHUZC: Max changed measure is %9.4g for column %4" HIGHSINT_FORMAT
        "",
        max_changed_measure_value, max_changed_measure_column);
  double best_measure = max_changed_measure_value;
  variable_in = -1;
  if (max_changed_measure_column >= 0) {
    // Use max_changed_measure_column if it is well defined and has
    // nonzero dual. It may have been zeroed because it is taboo
    if (workDual[max_changed_measure_column])
      variable_in = max_changed_measure_column;
  }
  const bool consider_nonbasic_free_column =
      (nonbasic_free_col_set.count() != 0);
  if (num_hyper_chuzc_candidates) {
    for (HighsInt iEntry = 1; iEntry <= num_hyper_chuzc_candidates; iEntry++) {
      HighsInt iCol = hyper_chuzc_candidate[iEntry];
      if (nonbasicFlag[iCol] == kNonbasicFlagFalse) {
        assert(!nonbasicMove[iCol]);
        continue;
      }
      // Assess any dual infeasibility
      double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
      if (consider_nonbasic_free_column) {
        if (nonbasic_free_col_set.in(iCol))
          dual_infeasibility = fabs(workDual[iCol]);
      }
      if (dual_infeasibility > dual_feasibility_tolerance) {
        if (dual_infeasibility * dual_infeasibility >
            best_measure * edge_weight_[iCol]) {
          best_measure =
              dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
          variable_in = iCol;
        }
      }
    }
  }
  if (variable_in != max_changed_measure_column) {
    if (report_hyper_chuzc)
      printf(
          ", and after HS CHUZC set it is now %9.4g for column "
          "%4" HIGHSINT_FORMAT "",
          best_measure, variable_in);
    max_hyper_chuzc_non_candidate_measure =
        max(max_changed_measure_value, max_hyper_chuzc_non_candidate_measure);
  }
  if (best_measure >= max_hyper_chuzc_non_candidate_measure) {
    // Candidate is at least as good as any unknown column, so accept it
    done_next_chuzc = true;
    if (report_hyper_chuzc)
      printf(", and no       has  measure >  %9.4g\n",
             max_hyper_chuzc_non_candidate_measure);
  } else {
    // Candidate isn't as good as best unknown column, so do a full CHUZC
    // Shouldn't claim to have done the next CHUZC
    assert(!done_next_chuzc);
    done_next_chuzc = false;
    initialise_hyper_chuzc = true;
    if (report_hyper_chuzc)
      printf(", but some may have measure >= %9.4g\n",
             max_hyper_chuzc_non_candidate_measure);
  }
  analysis->simplexTimerStop(ChuzcHyperClock);
}